

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstsout.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  
  if (argc == 2) {
    iVar1 = 0;
    lVar2 = 8;
LAB_0010138b:
    check_sysout(*(char **)((long)argv + lVar2),iVar1);
    exit(0);
  }
  if (argc == 3) {
    iVar1 = strncmp(argv[1],"-v",2);
    if (iVar1 == 0) {
      iVar1 = 1;
      lVar2 = 0x10;
      goto LAB_0010138b;
    }
  }
  fprintf(_stderr,"Usage: %s [-v] sysout-filename\n",*argv);
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {
    switch (argc) {
    case 2:
        check_sysout(argv[1], 0);
        break;
    case 3:
        if (0 == strncmp(argv[1], "-v", 2)) {
            check_sysout(argv[2], 1);
        } else {
            usage(argv[0]);
        }
        break;
    default:
        usage(argv[0]);
    }
  exit(0);
}